

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O0

int __thiscall cmVSLink::LinkIncremental(cmVSLink *this)

{
  byte bVar1;
  bool bVar2;
  int mtRet_00;
  ostream *poVar3;
  char *pcVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  int local_4b0;
  byte local_4aa;
  allocator<char> local_4a9;
  int mtRet;
  undefined1 local_488 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rcCommand;
  undefined1 local_450 [8];
  ofstream foutTmp;
  undefined1 local_248 [8];
  ofstream fout;
  undefined1 local_38 [8];
  string absManifestFile;
  cmVSLink *this_local;
  
  absManifestFile.field_2._8_8_ = this;
  cmsys::SystemTools::CollapseFullPath((string *)local_38,&this->ManifestFile);
  if ((this->Verbose & 1U) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Create ");
    poVar3 = std::operator<<(poVar3,(string *)&this->ManifestFileRC);
    std::operator<<(poVar3,"\n");
  }
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_248,pcVar4,_S_out);
  bVar1 = std::ios::operator!((ios *)(local_248 + (long)*(_func_int **)((long)local_248 + -0x18)));
  foutTmp._508_1_ = (bVar1 & 1) != 0;
  if ((bool)foutTmp._508_1_) {
    this_local._4_4_ = -1;
  }
  else {
    std::operator<<((ostream *)local_248,"#pragma code_page(65001)\n");
    poVar3 = (ostream *)std::ostream::operator<<(local_248,this->Type);
    poVar3 = std::operator<<(poVar3,
                             " /* CREATEPROCESS_MANIFEST_RESOURCE_ID */ 24 /* RT_MANIFEST */ \"");
    poVar3 = std::operator<<(poVar3,(string *)local_38);
    std::operator<<(poVar3,"\"");
  }
  foutTmp._509_3_ = 0;
  std::ofstream::~ofstream(local_248);
  if (foutTmp._508_4_ == 0) {
    bVar2 = cmsys::SystemTools::FileExists(&this->ManifestFile);
    if (!bVar2) {
      if ((this->Verbose & 1U) != 0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Create empty: ");
        poVar3 = std::operator<<(poVar3,(string *)&this->ManifestFile);
        std::operator<<(poVar3,"\n");
      }
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&this->UserManifests);
      if (bVar2) {
        pcVar4 = (char *)std::__cxx11::string::c_str();
        std::ofstream::ofstream(local_450,pcVar4,_S_out);
        std::ofstream::~ofstream(local_450);
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &rcCommand.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,"/out:",
                       &this->ManifestFile);
        RunMT(this,(string *)
                   &rcCommand.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
        std::__cxx11::string::~string
                  ((string *)
                   &rcCommand.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_488);
    uVar5 = std::__cxx11::string::empty();
    local_4aa = 0;
    if ((uVar5 & 1) == 0) {
      std::__cxx11::string::string((string *)&mtRet,(string *)&this->RcPath);
    }
    else {
      std::allocator<char>::allocator();
      local_4aa = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&mtRet,"rc",&local_4a9);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_488,(value_type *)&mtRet);
    std::__cxx11::string::~string((string *)&mtRet);
    if ((local_4aa & 1) != 0) {
      std::allocator<char>::~allocator(&local_4a9);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[4]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_488,
               (char (*) [4])"/fo");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_488,&this->ManifestFileRes);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_488,&this->ManifestFileRC);
    bVar2 = RunCommand("RC Pass 1",
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_488,(bool)(this->Verbose & 1),FORMAT_DECIMAL,(int *)0x0,
                       (_func_bool_int *)0x0);
    if (bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->LinkCommand,&this->ManifestFileRes);
      bVar2 = RunCommand("LINK Pass 1",&this->LinkCommand,(bool)(this->Verbose & 1),FORMAT_DECIMAL,
                         (int *)0x0,(_func_bool_int *)0x0);
      if (bVar2) {
        std::operator+(&local_4d0,"/out:",&this->ManifestFile);
        mtRet_00 = RunMT(this,&local_4d0,true);
        std::__cxx11::string::~string((string *)&local_4d0);
        local_4b0 = mtRet_00;
        bVar2 = mtRetIsUpdate(mtRet_00);
        if (bVar2) {
          bVar2 = RunCommand("RC Pass 2",
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_488,(bool)(this->Verbose & 1),FORMAT_DECIMAL,(int *)0x0,
                             (_func_bool_int *)0x0);
          if (bVar2) {
            bVar2 = RunCommand("FINAL LINK",&this->LinkCommand,(bool)(this->Verbose & 1),
                               FORMAT_DECIMAL,(int *)0x0,(_func_bool_int *)0x0);
            if (bVar2) {
              this_local._4_4_ = 0;
            }
            else {
              this_local._4_4_ = -1;
            }
          }
          else {
            this_local._4_4_ = -1;
          }
        }
        else {
          this_local._4_4_ = local_4b0;
        }
      }
      else {
        this_local._4_4_ = -1;
      }
    }
    else {
      this_local._4_4_ = -1;
    }
    foutTmp._508_4_ = 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_488);
  }
  std::__cxx11::string::~string((string *)local_38);
  return this_local._4_4_;
}

Assistant:

int cmVSLink::LinkIncremental()
{
  // This follows the steps listed here:
  // http://blogs.msdn.com/zakramer/archive/2006/05/22/603558.aspx

  //    1.  Compiler compiles the application and generates the *.obj files.
  //    2.  An empty manifest file is generated if this is a clean build and
  //    if not the previous one is reused.
  //    3.  The resource compiler (rc.exe) compiles the *.manifest file to a
  //    *.res file.
  //    4.  Linker generates the binary (EXE or DLL) with the /incremental
  //    switch and embeds the dummy manifest file. The linker also generates
  //    the real manifest file based on the binaries that your binary depends
  //    on.
  //    5.  The manifest tool (mt.exe) is then used to generate the final
  //    manifest.

  // If the final manifest is changed, then 6 and 7 are run, if not
  // they are skipped, and it is done.

  //    6.  The resource compiler is invoked one more time.
  //    7.  Finally, the Linker does another incremental link, but since the
  //    only thing that has changed is the *.res file that contains the
  //    manifest it is a short link.

  // Create a resource file referencing the manifest.
  std::string absManifestFile =
    cmSystemTools::CollapseFullPath(this->ManifestFile);
  if (this->Verbose) {
    std::cout << "Create " << this->ManifestFileRC << "\n";
  }
  {
    cmsys::ofstream fout(this->ManifestFileRC.c_str());
    if (!fout) {
      return -1;
    }
    // Insert a pragma statement to specify utf-8 encoding.
    fout << "#pragma code_page(65001)\n";
    fout << this->Type
         << " /* CREATEPROCESS_MANIFEST_RESOURCE_ID */ "
            "24 /* RT_MANIFEST */ \""
         << absManifestFile << "\"";
  }

  // If we have not previously generated a manifest file,
  // generate a manifest file so the resource compiler succeeds.
  if (!cmSystemTools::FileExists(this->ManifestFile)) {
    if (this->Verbose) {
      std::cout << "Create empty: " << this->ManifestFile << "\n";
    }
    if (this->UserManifests.empty()) {
      // generate an empty manifest because there are no user provided
      // manifest files.
      cmsys::ofstream foutTmp(this->ManifestFile.c_str());
    } else {
      this->RunMT("/out:" + this->ManifestFile, false);
    }
  }

  // Compile the resource file.
  std::vector<std::string> rcCommand;
  rcCommand.push_back(this->RcPath.empty() ? "rc" : this->RcPath);
  rcCommand.emplace_back("/fo");
  rcCommand.push_back(this->ManifestFileRes);
  rcCommand.push_back(this->ManifestFileRC);
  if (!RunCommand("RC Pass 1", rcCommand, this->Verbose, FORMAT_DECIMAL)) {
    return -1;
  }

  // Tell the linker to use our manifest compiled into a resource.
  this->LinkCommand.push_back(this->ManifestFileRes);

  // Run the link command (possibly generates intermediate manifest).
  if (!RunCommand("LINK Pass 1", this->LinkCommand, this->Verbose,
                  FORMAT_DECIMAL)) {
    return -1;
  }

  // Run the manifest tool to create the final manifest.
  int mtRet = this->RunMT("/out:" + this->ManifestFile, true);

  // If mt returns a special value then it updated the manifest file so
  // we need to embed it again.  Otherwise we are done.
  if (!mtRetIsUpdate(mtRet)) {
    return mtRet;
  }

  // Compile the resource file again.
  if (!RunCommand("RC Pass 2", rcCommand, this->Verbose, FORMAT_DECIMAL)) {
    return -1;
  }

  // Link incrementally again to use the updated resource.
  if (!RunCommand("FINAL LINK", this->LinkCommand, this->Verbose,
                  FORMAT_DECIMAL)) {
    return -1;
  }
  return 0;
}